

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_filter.c
# Opt level: O2

void FilterSegment(double *in_data,PitchFilterParam *parameters,double *out_data,
                  double (*out_dg) [264])

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  double *pdVar10;
  double (*padVar11) [5];
  long lVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  long local_60;
  
  uVar5 = (ulong)parameters->index;
  iVar7 = parameters->index + 0xbe;
  iVar2 = parameters->lag_offset;
  iVar9 = parameters->num_samples;
  lVar15 = (long)iVar7;
  iVar6 = 0;
  if (iVar9 < 1) {
    iVar9 = 0;
  }
  pdVar14 = parameters->buffer + (iVar7 - iVar2);
  local_60 = uVar5 * 8 + (long)iVar2 * -8 + (long)out_dg;
  for (; iVar6 != iVar9; iVar6 = iVar6 + 1) {
    for (lVar8 = 0; lVar8 != -4; lVar8 = lVar8 + -1) {
      parameters->damper_state[lVar8 + 4] = parameters->damper_state[lVar8 + 3];
    }
    pdVar4 = parameters->interpol_coeff;
    dVar17 = 0.0;
    for (lVar8 = 0; lVar8 != 9; lVar8 = lVar8 + 1) {
      dVar17 = dVar17 + pdVar14[lVar8] * pdVar4[lVar8];
    }
    dVar1 = parameters->gain;
    parameters->damper_state[0] = dVar17 * dVar1;
    iVar7 = (int)uVar5;
    if (parameters->mode == kPitchFilterPreGain) {
      lVar8 = 4;
      pdVar10 = parameters->damper_state_dg[0] + 4;
      while (bVar16 = lVar8 != 0, lVar8 = lVar8 + -1, bVar16) {
        for (lVar12 = 0; lVar12 != 0xa0; lVar12 = lVar12 + 0x28) {
          *(undefined8 *)((long)pdVar10 + lVar12) = *(undefined8 *)((long)pdVar10 + lVar12 + -8);
        }
        pdVar10 = pdVar10 + -1;
      }
      iVar3 = parameters->sub_frame;
      lVar8 = local_60;
      for (lVar12 = 0; lVar12 <= iVar3; lVar12 = lVar12 + 1) {
        dVar18 = 0.0;
        for (lVar13 = 8; (iVar7 - iVar2 >> 0x1f & -(iVar7 - iVar2)) <= lVar13; lVar13 = lVar13 + -1)
        {
          dVar18 = dVar18 + *(double *)(lVar8 + lVar13 * 8) * pdVar4[lVar13];
        }
        parameters->damper_state_dg[lVar12][0] =
             parameters->gain_mult[lVar12] * dVar17 + dVar18 * dVar1;
        lVar8 = lVar8 + 0x840;
      }
      padVar11 = parameters->damper_state_dg;
      for (lVar8 = 0; lVar8 <= iVar3; lVar8 = lVar8 + 1) {
        dVar17 = 0.0;
        for (lVar12 = 0; lVar12 != 0x28; lVar12 = lVar12 + 8) {
          dVar17 = dVar17 - *(double *)((long)*padVar11 + lVar12) *
                            *(double *)((long)kDampFilter + lVar12);
        }
        out_dg[lVar8][iVar7] = dVar17;
        padVar11 = padVar11 + 1;
      }
    }
    dVar17 = 0.0;
    for (lVar8 = 0; lVar8 != 0x28; lVar8 = lVar8 + 8) {
      dVar17 = dVar17 + *(double *)((long)parameters->damper_state + lVar8) *
                        *(double *)((long)kDampFilter + lVar8);
    }
    dVar1 = in_data[iVar7];
    out_data[iVar7] = dVar1 - dVar17;
    parameters->buffer[lVar15] = (dVar1 - dVar17) + in_data[iVar7];
    uVar5 = (ulong)(iVar7 + 1U);
    parameters->index = iVar7 + 1U;
    lVar15 = lVar15 + 1;
    pdVar14 = pdVar14 + 1;
    local_60 = local_60 + 8;
  }
  return;
}

Assistant:

static void FilterSegment(const double* in_data, PitchFilterParam* parameters,
                          double* out_data,
                          double out_dg[][PITCH_FRAME_LEN + QLOOKAHEAD]) {
  int n;
  int m;
  int j;
  double sum;
  double sum2;
  /* Index of |parameters->buffer| where the output is written to. */
  int pos = parameters->index + PITCH_BUFFSIZE;
  /* Index of |parameters->buffer| where samples are read for fractional-lag
   * computation. */
  int pos_lag = pos - parameters->lag_offset;

  for (n = 0; n < parameters->num_samples; ++n) {
    /* Shift low pass filter states. */
    for (m = PITCH_DAMPORDER - 1; m > 0; --m) {
      parameters->damper_state[m] = parameters->damper_state[m - 1];
    }
    /* Filter to get fractional pitch. */
    sum = 0.0;
    for (m = 0; m < PITCH_FRACORDER; ++m) {
      sum += parameters->buffer[pos_lag + m] * parameters->interpol_coeff[m];
    }
    /* Multiply with gain. */
    parameters->damper_state[0] = parameters->gain * sum;

    if (parameters->mode == kPitchFilterPreGain) {
      int lag_index = parameters->index - parameters->lag_offset;
      int m_tmp = (lag_index < 0) ? -lag_index : 0;
      /* Update the damper state for the new sample. */
      for (m = PITCH_DAMPORDER - 1; m > 0; --m) {
        for (j = 0; j < 4; ++j) {
          parameters->damper_state_dg[j][m] =
              parameters->damper_state_dg[j][m - 1];
        }
      }

      for (j = 0; j < parameters->sub_frame + 1; ++j) {
        /* Filter for fractional pitch. */
        sum2 = 0.0;
        for (m = PITCH_FRACORDER-1; m >= m_tmp; --m) {
          /* |lag_index + m| is always larger than or equal to zero, see how
           * m_tmp is computed. This is equivalent to assume samples outside
           * |out_dg[j]| are zero. */
          sum2 += out_dg[j][lag_index + m] * parameters->interpol_coeff[m];
        }
        /* Add the contribution of differential gain change. */
        parameters->damper_state_dg[j][0] = parameters->gain_mult[j] * sum +
            parameters->gain * sum2;
      }

      /* Filter with damping filter, and store the results. */
      for (j = 0; j < parameters->sub_frame + 1; ++j) {
        sum = 0.0;
        for (m = 0; m < PITCH_DAMPORDER; ++m) {
          sum -= parameters->damper_state_dg[j][m] * kDampFilter[m];
        }
        out_dg[j][parameters->index] = sum;
      }
    }
    /* Filter with damping filter. */
    sum = 0.0;
    for (m = 0; m < PITCH_DAMPORDER; ++m) {
      sum += parameters->damper_state[m] * kDampFilter[m];
    }

    /* Subtract from input and update buffer. */
    out_data[parameters->index] = in_data[parameters->index] - sum;
    parameters->buffer[pos] = in_data[parameters->index] +
        out_data[parameters->index];

    ++parameters->index;
    ++pos;
    ++pos_lag;
  }
  return;
}